

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function-c.cpp
# Opt level: O2

void __thiscall duckdb::CTableBindData::~CTableBindData(CTableBindData *this)

{
  (this->super_TableFunctionData).super_FunctionData._vptr_FunctionData =
       (_func_int **)&PTR__CTableBindData_017a74a8;
  if ((this->bind_data != (void *)0x0) && (this->delete_callback != (duckdb_delete_callback_t)0x0))
  {
    (*this->delete_callback)(this->bind_data);
  }
  this->bind_data = (void *)0x0;
  this->delete_callback = (duckdb_delete_callback_t)0x0;
  ::std::unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>::
  ~unique_ptr(&(this->stats).
               super_unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>
             );
  TableFunctionData::~TableFunctionData(&this->super_TableFunctionData);
  return;
}

Assistant:

~CTableBindData() override {
		if (bind_data && delete_callback) {
			delete_callback(bind_data);
		}
		bind_data = nullptr;
		delete_callback = nullptr;
	}